

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Abc_NtkRecDumpTt3(char *pFileName,int fBinary)

{
  ulong *puVar1;
  uint uVar2;
  uint nVars;
  Lms_Man_t *pLVar3;
  FILE *__s;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Vec_Mem_t *pVVar6;
  ulong uVar7;
  void *__base;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  word *pTruth;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong *puVar19;
  ulong uVar20;
  size_t __size;
  char cVar21;
  bool bVar22;
  char pBuffer [1000];
  char local_418 [1000];
  
  pLVar3 = s_pMan3;
  uVar2 = s_pMan3->vTtMem->nEntries;
  uVar12 = (ulong)uVar2;
  if (uVar12 == 0) {
    pcVar5 = "There is not truth tables.";
  }
  else {
    nVars = s_pMan3->nVars;
    __s = fopen(pFileName,"wb");
    if (__s != (FILE *)0x0) {
      pVVar4 = (Vec_Str_t *)malloc(0x10);
      uVar9 = 0x10;
      if (0x10 < uVar2) {
        uVar9 = uVar2;
      }
      pVVar4->nSize = 0;
      pVVar4->nCap = uVar9;
      pcVar5 = (char *)malloc((long)(int)uVar9);
      pVVar4->pArray = pcVar5;
      pLVar3->vSupps = pVVar4;
      pVVar6 = pLVar3->vTtMem;
      if (0 < pVVar6->nEntries) {
        iVar14 = nVars - 6;
        uVar10 = 1 << ((byte)iVar14 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar10) {
          uVar13 = (ulong)uVar10;
        }
        uVar15 = 0;
        do {
          if (pVVar6->ppPages[uVar15 >> ((byte)pVVar6->LogPageSze & 0x1f)] == (word *)0x0) break;
          cVar21 = '\0';
          if (0 < (int)nVars) {
            puVar1 = pVVar6->ppPages[uVar15 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                     (int)((pVVar6->PageMask & uVar15) * pVVar6->nEntrySize);
            uVar7 = 0;
            do {
              if ((int)nVars < 7) {
                bVar22 = (s_Truths6Neg[uVar7] &
                         (*puVar1 >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^ *puVar1)) != 0;
              }
              else {
                bVar22 = false;
                if (uVar7 < 6) {
                  if (iVar14 != 0x1f) {
                    uVar17 = 0;
                    do {
                      if (((puVar1[uVar17] >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^
                           puVar1[uVar17]) & s_Truths6Neg[uVar7]) != 0) {
                        bVar22 = true;
                        break;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar13 != uVar17);
                  }
                }
                else if (iVar14 != 0x1f) {
                  bVar8 = (byte)(uVar7 - 6);
                  uVar11 = 1 << (bVar8 & 0x1f);
                  iVar16 = 2 << (bVar8 & 0x1f);
                  uVar17 = 1;
                  if (1 < (int)uVar11) {
                    uVar17 = (ulong)uVar11;
                  }
                  puVar18 = puVar1 + (int)uVar11;
                  puVar19 = puVar1;
                  do {
                    if (uVar7 - 6 != 0x1f) {
                      uVar20 = 0;
                      do {
                        if (puVar19[uVar20] != puVar18[uVar20]) {
                          bVar22 = true;
                          goto LAB_002faf27;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar17 != uVar20);
                    }
                    puVar19 = puVar19 + iVar16;
                    puVar18 = puVar18 + iVar16;
                  } while (puVar19 < puVar1 + (int)uVar10);
                }
              }
LAB_002faf27:
              cVar21 = cVar21 + bVar22;
              uVar7 = uVar7 + 1;
            } while (uVar7 != nVars);
          }
          pVVar4 = pLVar3->vSupps;
          uVar11 = pVVar4->nCap;
          if (pVVar4->nSize == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar5;
              __size = 0x10;
            }
            else {
              __size = (ulong)uVar11 * 2;
              if ((int)__size <= (int)uVar11) goto LAB_002fb076;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(__size);
              }
              else {
                pcVar5 = (char *)realloc(pVVar4->pArray,__size);
              }
              pVVar4->pArray = pcVar5;
            }
            pVVar4->nCap = (int)__size;
          }
LAB_002fb076:
          iVar16 = pVVar4->nSize;
          pVVar4->nSize = iVar16 + 1;
          pVVar4->pArray[iVar16] = cVar21;
          uVar15 = uVar15 + 1;
          pVVar6 = pLVar3->vTtMem;
        } while ((int)uVar15 < pVVar6->nEntries);
      }
      __base = malloc((long)(int)uVar9 << 2);
      if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          *(int *)((long)__base + uVar13 * 4) = (int)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      qsort(__base,(long)(int)uVar2,4,Abc_NtkRecTruthCompare);
      if (pLVar3->vSupps != (Vec_Str_t *)0x0) {
        pcVar5 = pLVar3->vSupps->pArray;
        if (pcVar5 != (char *)0x0) {
          free(pcVar5);
          pLVar3->vSupps->pArray = (char *)0x0;
        }
        if (pLVar3->vSupps != (Vec_Str_t *)0x0) {
          free(pLVar3->vSupps);
          pLVar3->vSupps = (Vec_Str_t *)0x0;
        }
      }
      if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          uVar2 = *(uint *)((long)__base + uVar13 * 4);
          if (((int)uVar2 < 0) || (pVVar6 = pLVar3->vTtMem, pVVar6->nEntries <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nEntries",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                          ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
          }
          pTruth = pVVar6->ppPages[uVar2 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                   (long)(int)(pVVar6->PageMask & uVar2) * (long)pVVar6->nEntrySize;
          if (fBinary == 0) {
            Extra_PrintHex((FILE *)__s,(uint *)pTruth,nVars);
            fwrite("  ",2,1,__s);
            Dau_DsdDecompose(pTruth,pLVar3->nVars,0,(uint)((int)nVars < 0xb),local_418);
            fprintf(__s,"%s\n",local_418);
          }
          else {
            fwrite(pTruth,1,(long)pLVar3->nWords << 3,__s);
          }
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      fclose(__s);
      if (__base != (void *)0x0) {
        free(__base);
      }
      return;
    }
    pcVar5 = "The file cannot be opened.";
  }
  puts(pcVar5);
  return;
}

Assistant:

void Abc_NtkRecDumpTt3( char * pFileName, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    Lms_Man_t * p = s_pMan3;
    Vec_Int_t * vEntries;
    word * pTruth;
    int i, Entry, nVars = p->nVars;
    int nEntries = Vec_MemEntryNum(p->vTtMem);
    if ( nEntries == 0 )
    {
        printf( "There is not truth tables.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "The file cannot be opened.\n" );
        return;
    }
    p->vSupps = Vec_StrAlloc( nEntries );
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
        Vec_StrPush( p->vSupps, (char)Abc_TtSupportSize(pTruth, nVars) );
    vEntries = Vec_IntStartNatural( nEntries );
    qsort( (void *)Vec_IntArray(vEntries), (size_t)nEntries, sizeof(int), (int(*)(const void *,const void *))Abc_NtkRecTruthCompare );
    Vec_StrFreeP( &p->vSupps );
    // write the file
    Vec_IntForEachEntry( vEntries, Entry, i )
    {
        pTruth = Vec_MemReadEntry(p->vTtMem, Entry);
        if ( fBinary )
        {
            fwrite( pTruth, 1, sizeof(word) * p->nWords, pFile );
            continue;
        }
        Extra_PrintHex( pFile, (unsigned *)pTruth, nVars );
        fprintf( pFile, "  " );
//        Kit_DsdWriteFromTruth( pBuffer, (unsigned *)pTruth, nVars );
        Dau_DsdDecompose( pTruth, p->nVars, 0, (int)(nVars <= 10), pBuffer );
        fprintf( pFile, "%s\n", pBuffer );
    }
    fclose( pFile );
    Vec_IntFree( vEntries );
}